

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O0

string * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::getName_abi_cxx11_
          (ThreeAxisAngularAccelerometerSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,*(string **)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string ThreeAxisAngularAccelerometerSensor::getName() const
{
    return this->pimpl->name;
}